

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_chacha20poly1305.cc
# Opt level: O2

void calc_tag(uint8_t *tag,uint8_t *key,uint8_t *nonce,uint8_t *ad,size_t ad_len,uint8_t *ciphertext
             ,size_t ciphertext_len,uint8_t *ciphertext_extra,size_t ciphertext_extra_len)

{
  ulong uVar1;
  uint8_t poly1305_key [32];
  poly1305_state ctx;
  
  poly1305_key[0x10] = '\0';
  poly1305_key[0x11] = '\0';
  poly1305_key[0x12] = '\0';
  poly1305_key[0x13] = '\0';
  poly1305_key[0x14] = '\0';
  poly1305_key[0x15] = '\0';
  poly1305_key[0x16] = '\0';
  poly1305_key[0x17] = '\0';
  poly1305_key[0x18] = '\0';
  poly1305_key[0x19] = '\0';
  poly1305_key[0x1a] = '\0';
  poly1305_key[0x1b] = '\0';
  poly1305_key[0x1c] = '\0';
  poly1305_key[0x1d] = '\0';
  poly1305_key[0x1e] = '\0';
  poly1305_key[0x1f] = '\0';
  poly1305_key[0] = '\0';
  poly1305_key[1] = '\0';
  poly1305_key[2] = '\0';
  poly1305_key[3] = '\0';
  poly1305_key[4] = '\0';
  poly1305_key[5] = '\0';
  poly1305_key[6] = '\0';
  poly1305_key[7] = '\0';
  poly1305_key[8] = '\0';
  poly1305_key[9] = '\0';
  poly1305_key[10] = '\0';
  poly1305_key[0xb] = '\0';
  poly1305_key[0xc] = '\0';
  poly1305_key[0xd] = '\0';
  poly1305_key[0xe] = '\0';
  poly1305_key[0xf] = '\0';
  CRYPTO_chacha_20(poly1305_key,poly1305_key,0x20,key,nonce,0);
  CRYPTO_poly1305_init(&ctx,poly1305_key);
  CRYPTO_poly1305_update(&ctx,ad,ad_len);
  if ((ad_len & 0xf) != 0) {
    CRYPTO_poly1305_update(&ctx,"",0x10 - (ad_len & 0xf));
  }
  CRYPTO_poly1305_update(&ctx,ciphertext,ciphertext_len);
  CRYPTO_poly1305_update(&ctx,ciphertext_extra,ciphertext_extra_len);
  uVar1 = ciphertext_extra_len + ciphertext_len & 0xf;
  if (uVar1 != 0) {
    CRYPTO_poly1305_update(&ctx,"",0x10 - uVar1);
  }
  poly1305_update_length(&ctx,ad_len);
  poly1305_update_length(&ctx,ciphertext_extra_len + ciphertext_len);
  CRYPTO_poly1305_finish(&ctx,tag);
  return;
}

Assistant:

static void calc_tag(uint8_t tag[POLY1305_TAG_LEN], const uint8_t *key,
                     const uint8_t nonce[12], const uint8_t *ad, size_t ad_len,
                     const uint8_t *ciphertext, size_t ciphertext_len,
                     const uint8_t *ciphertext_extra,
                     size_t ciphertext_extra_len) {
  alignas(16) uint8_t poly1305_key[32];
  OPENSSL_memset(poly1305_key, 0, sizeof(poly1305_key));
  CRYPTO_chacha_20(poly1305_key, poly1305_key, sizeof(poly1305_key), key, nonce,
                   0);

  static const uint8_t padding[16] = { 0 };  // Padding is all zeros.
  poly1305_state ctx;
  CRYPTO_poly1305_init(&ctx, poly1305_key);
  CRYPTO_poly1305_update(&ctx, ad, ad_len);
  if (ad_len % 16 != 0) {
    CRYPTO_poly1305_update(&ctx, padding, sizeof(padding) - (ad_len % 16));
  }
  CRYPTO_poly1305_update(&ctx, ciphertext, ciphertext_len);
  CRYPTO_poly1305_update(&ctx, ciphertext_extra, ciphertext_extra_len);
  const size_t ciphertext_total = ciphertext_len + ciphertext_extra_len;
  if (ciphertext_total % 16 != 0) {
    CRYPTO_poly1305_update(&ctx, padding,
                           sizeof(padding) - (ciphertext_total % 16));
  }
  poly1305_update_length(&ctx, ad_len);
  poly1305_update_length(&ctx, ciphertext_total);
  CRYPTO_poly1305_finish(&ctx, tag);
}